

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2cod.c
# Opt level: O0

jpc_pi_t * jpc_pi_create0(void)

{
  jpc_pchglist_t *pjVar1;
  jpc_pi_t *pi;
  
  pi = (jpc_pi_t *)jas_malloc(0xb8);
  if (pi == (jpc_pi_t *)0x0) {
    pi = (jpc_pi_t *)0x0;
  }
  else {
    pi->picomps = (jpc_picomp_t *)0x0;
    pi->pchgno = 0;
    pjVar1 = jpc_pchglist_create();
    pi->pchglist = pjVar1;
    if (pjVar1 == (jpc_pchglist_t *)0x0) {
      jas_free(pi);
      pi = (jpc_pi_t *)0x0;
    }
  }
  return pi;
}

Assistant:

jpc_pi_t *jpc_pi_create0()
{
	jpc_pi_t *pi;
	if (!(pi = jas_malloc(sizeof(jpc_pi_t)))) {
		return 0;
	}
	pi->picomps = 0;
	pi->pchgno = 0;
	if (!(pi->pchglist = jpc_pchglist_create())) {
		jas_free(pi);
		return 0;
	}
	return pi;
}